

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

IVec4 __thiscall tcu::getTextureFormatMantissaBitDepth(tcu *this,TextureFormat *format)

{
  int i;
  TextureSwizzle *pTVar1;
  long lVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  Vector<int,_4> *res;
  long lVar6;
  undefined4 *puVar7;
  long lVar8;
  Channel CVar9;
  Channel CVar11;
  Channel CVar12;
  Channel CVar13;
  undefined1 auVar10 [16];
  undefined1 auVar14 [16];
  IVec4 IVar15;
  undefined8 local_68;
  undefined8 uStack_60;
  uint local_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  undefined1 local_38 [16];
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  
  switch(format->type) {
  case SNORM_INT8:
  case SNORM_INT16:
  case SNORM_INT32:
  case UNORM_INT8:
  case UNORM_INT16:
  case UNORM_INT24:
  case UNORM_INT32:
  case UNORM_BYTE_44:
  case UNORM_SHORT_565:
  case UNORM_SHORT_555:
  case UNORM_SHORT_4444:
  case UNORM_SHORT_5551:
  case UNORM_SHORT_1555:
  case UNORM_INT_101010:
  case SNORM_INT_1010102_REV:
  case UNORM_INT_1010102_REV:
  case UNSIGNED_BYTE_44:
  case UNSIGNED_SHORT_565:
  case UNSIGNED_SHORT_4444:
  case UNSIGNED_SHORT_5551:
  case SIGNED_INT_1010102_REV:
  case UNSIGNED_INT_1010102_REV:
  case UNSIGNED_INT_999_E5_REV:
  case UNSIGNED_INT_16_8_8:
  case UNSIGNED_INT_24_8:
  case UNSIGNED_INT_24_8_REV:
  case SIGNED_INT8:
  case SIGNED_INT16:
  case SIGNED_INT32:
  case UNSIGNED_INT8:
  case UNSIGNED_INT16:
  case UNSIGNED_INT24:
  case UNSIGNED_INT32:
    getChannelBitDepth(format->type);
    break;
  case UNSIGNED_INT_11F_11F_10F_REV:
    local_68 = 0x600000006;
    uStack_60 = 5;
    break;
  case HALF_FLOAT:
    local_68 = 0xa0000000a;
    uStack_60 = 0xa0000000a;
    break;
  case FLOAT:
    local_68 = 0x1700000017;
    uStack_60 = 0x1700000017;
    break;
  case FLOAT64:
    local_68 = 0x3400000034;
    uStack_60 = 0x3400000034;
    break;
  case FLOAT_UNSIGNED_INT_24_8_REV:
    local_68 = 0x800000017;
    uStack_60 = 0;
    break;
  default:
    local_68 = 0;
    uStack_60 = 0;
  }
  pTVar1 = getChannelReadSwizzle(format->order);
  CVar9 = pTVar1->components[0] ^ 0x80000000;
  CVar11 = pTVar1->components[1] ^ 0x80000000;
  CVar12 = pTVar1->components[2] ^ 0x80000000;
  CVar13 = pTVar1->components[3] ^ 0x80000000;
  local_48 = -(uint)((int)CVar9 < -0x7ffffffc);
  uStack_44 = -(uint)((int)CVar11 < -0x7ffffffc);
  uStack_40 = -(uint)((int)CVar12 < -0x7ffffffc);
  uStack_3c = -(uint)((int)CVar13 < -0x7ffffffc);
  auVar10._0_4_ = -(uint)(-0x7ffffffd < (int)CVar9);
  auVar10._4_4_ = -(uint)(-0x7ffffffd < (int)CVar11);
  auVar10._8_4_ = -(uint)(-0x7ffffffd < (int)CVar12);
  auVar10._12_4_ = -(uint)(-0x7ffffffd < (int)CVar13);
  auVar10 = packssdw(auVar10,auVar10);
  auVar14._8_4_ = 0xffffffff;
  auVar14._0_8_ = 0xffffffffffffffff;
  auVar14._12_4_ = 0xffffffff;
  auVar10 = packsswb(auVar14 ^ auVar10,auVar14 ^ auVar10);
  local_4c = auVar10._0_4_ & (uint)DAT_00639710;
  lVar2 = 0;
  lVar3 = (long)(int)pTVar1->components[0];
  if ((local_48 & 1) == 0) {
    lVar3 = lVar2;
  }
  lVar5 = (long)(int)pTVar1->components[1];
  if ((uStack_44 & 1) == 0) {
    lVar5 = lVar2;
  }
  lVar6 = (long)(int)pTVar1->components[2];
  if ((uStack_40 & 1) == 0) {
    lVar6 = lVar2;
  }
  lVar8 = (long)(int)pTVar1->components[3];
  if ((uStack_3c & 1) == 0) {
    lVar8 = lVar2;
  }
  puVar4 = &local_20;
  local_20 = *(undefined4 *)((long)&local_68 + lVar3 * 4);
  local_1c = *(undefined4 *)((long)&local_68 + lVar5 * 4);
  local_18 = *(undefined4 *)((long)&local_68 + lVar6 * 4);
  local_14 = *(undefined4 *)((long)&local_68 + lVar8 * 4);
  IVar15.m_data._8_8_ = (undefined4 *)local_38;
  local_38 = (undefined1  [16])0x0;
  *(undefined1 (*) [16])this = (undefined1  [16])0x0;
  do {
    puVar7 = IVar15.m_data._8_8_;
    if (*(char *)((long)&local_4c + lVar2) != '\0') {
      puVar7 = puVar4;
    }
    *(undefined4 *)(this + lVar2 * 4) = *puVar7;
    lVar2 = lVar2 + 1;
    IVar15.m_data._8_8_ = IVar15.m_data._8_8_ + 1;
    puVar4 = puVar4 + 1;
  } while (lVar2 != 4);
  IVar15.m_data._0_8_ = this;
  return (IVec4)IVar15.m_data;
}

Assistant:

IVec4 getTextureFormatMantissaBitDepth (const TextureFormat& format)
{
	const IVec4						chnBits		= getChannelMantissaBitDepth(format.type);
	const TextureSwizzle::Channel*	map			= getChannelReadSwizzle(format.order).components;
	const BVec4						chnMask		= BVec4(deInRange32(map[0], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[1], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[2], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[3], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE);
	const IVec4						chnSwz		= IVec4((chnMask[0]) ? ((int)map[0]) : (0),
														(chnMask[1]) ? ((int)map[1]) : (0),
														(chnMask[2]) ? ((int)map[2]) : (0),
														(chnMask[3]) ? ((int)map[3]) : (0));

	return select(chnBits.swizzle(chnSwz.x(), chnSwz.y(), chnSwz.z(), chnSwz.w()), IVec4(0), chnMask);
}